

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O0

string * __thiscall Lexer::DescribeLastError_abi_cxx11_(string *__return_storage_ptr__,Lexer *this)

{
  allocator<char> local_2d [20];
  allocator<char> local_19;
  Lexer *local_18;
  Lexer *this_local;
  
  local_18 = this;
  this_local = (Lexer *)__return_storage_ptr__;
  if ((this->last_token_ == (char *)0x0) || (*this->last_token_ != '\t')) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"lexing error",local_2d);
    std::allocator<char>::~allocator(local_2d);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"tabs are not allowed, use spaces",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

string Lexer::DescribeLastError() {
  if (last_token_) {
    switch (last_token_[0]) {
    case '\t':
      return "tabs are not allowed, use spaces";
    }
  }
  return "lexing error";
}